

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

BOOL Js::JavascriptObject::CreateDataProperty
               (RecyclableObject *obj,PropertyId key,Var value,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  undefined1 local_58 [8];
  PropertyDescriptor newDesc;
  ScriptContext *scriptContext_local;
  Var value_local;
  PropertyId key_local;
  RecyclableObject *obj_local;
  
  newDesc._40_8_ = scriptContext;
  BVar3 = Js::JavascriptOperators::IsObject(obj);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x71b,"(JavascriptOperators::IsObject(obj))",
                                "JavascriptOperators::IsObject(obj)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_58);
  PropertyDescriptor::SetValue((PropertyDescriptor *)local_58,value);
  PropertyDescriptor::SetWritable((PropertyDescriptor *)local_58,true);
  PropertyDescriptor::SetEnumerable((PropertyDescriptor *)local_58,true);
  PropertyDescriptor::SetConfigurable((PropertyDescriptor *)local_58,true);
  BVar3 = DefineOwnPropertyHelper
                    (obj,key,(PropertyDescriptor *)local_58,(ScriptContext *)newDesc._40_8_,true);
  return BVar3;
}

Assistant:

BOOL JavascriptObject::CreateDataProperty(RecyclableObject* obj, PropertyId key, Var value, ScriptContext* scriptContext)
{
    // Performs CreateDataProperty operation as outlined in https://tc39.github.io/ecma262/#sec-createdataproperty.
    // 1. Assert: Type(obj) is Object
    // 2. Assert: IsPropertyKey(key) is true
    Assert(JavascriptOperators::IsObject(obj));

    // 3. Let newDesc be the PropertyDescriptor{[[Value]]: V, [[Writable]]: true, [[Enumerable]]: true, [[Configurable]]: true}.
    PropertyDescriptor newDesc;
    newDesc.SetValue(value);
    newDesc.SetWritable(true);
    newDesc.SetEnumerable(true);
    newDesc.SetConfigurable(true);

    // 4. Return ? O.[[DefineOwnProperty]](P, newDesc).
    return DefineOwnPropertyHelper(obj, key, newDesc, scriptContext);
}